

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O0

fdb_status
fdb_snapshot_open(fdb_kvs_handle *handle_in,fdb_kvs_handle **ptr_handle,fdb_seqnum_t seqnum)

{
  file_status_t fVar1;
  fdb_seqnum_t fVar2;
  filemgr_dirty_update_node *pfVar3;
  list_elem *in_RDX;
  undefined8 *in_RSI;
  fdb_kvs_handle *in_RDI;
  filemgr_dirty_update_node *dirty_update_1;
  filemgr_dirty_update_node *dirty_update;
  bid_t dirty_seqtree_root;
  bid_t dirty_idtree_root;
  bool clone_snapshot;
  _fdb_key_cmp_info cmp_info;
  snap_handle dummy_shandle;
  file_status_t fstatus;
  filemgr *file;
  fdb_status fs;
  fdb_txn *txn;
  fdb_kvs_handle *handle;
  fdb_kvs_id_t kv_id;
  fdb_kvs_config kvs_config;
  fdb_config config;
  fdb_config *in_stack_000019b0;
  fdb_filename_mode_t in_stack_000019bc;
  char *in_stack_000019c0;
  fdb_kvs_handle *in_stack_000019c8;
  filemgr *in_stack_fffffffffffffd28;
  filemgr *in_stack_fffffffffffffd30;
  fdb_kvs_handle *in_stack_fffffffffffffd38;
  fdb_kvs_handle *in_stack_fffffffffffffd40;
  filemgr *in_stack_fffffffffffffd48;
  filemgr *in_stack_fffffffffffffd50;
  filemgr *in_stack_fffffffffffffd58;
  fdb_kvs_handle *in_stack_fffffffffffffd60;
  fdb_kvs_handle *in_stack_fffffffffffffd68;
  char *in_stack_fffffffffffffd70;
  char *in_stack_fffffffffffffd78;
  filemgr *in_stack_fffffffffffffd80;
  fdb_kvs_config *in_stack_fffffffffffffd88;
  undefined7 in_stack_fffffffffffffd90;
  byte bVar4;
  fdb_kvs_handle *root_handle;
  fdb_kvs_handle *handle_00;
  undefined1 is_multi_kv;
  snap_handle *in_stack_fffffffffffffdb8;
  filemgr *in_stack_fffffffffffffdc0;
  fdb_kvs_handle *in_stack_fffffffffffffdd8;
  filemgr *in_stack_fffffffffffffe00;
  fdb_kvs_handle *in_stack_fffffffffffffe08;
  file_status_t local_161;
  filemgr *local_160;
  fdb_status local_154;
  fdb_txn *local_150;
  filemgr *local_148;
  fdb_kvs_id_t local_140;
  undefined8 local_138;
  fdb_custom_cmp_variable local_130;
  void *local_128;
  undefined1 local_120 [36];
  uint local_fc;
  undefined1 local_f2;
  list_elem *local_28;
  undefined8 *local_20;
  fdb_kvs_handle *local_18;
  fdb_status local_c;
  
  if ((in_RDI == (fdb_kvs_handle *)0x0) || (in_RSI == (undefined8 *)0x0)) {
    local_c = FDB_RESULT_INVALID_HANDLE;
  }
  else {
    local_28 = in_RDX;
    local_20 = in_RSI;
    local_18 = in_RDI;
    memcpy(local_120,&in_RDI->config,0xf8);
    local_138 = *(undefined8 *)&local_18->kvs_config;
    local_130 = (local_18->kvs_config).custom_cmp;
    local_128 = (local_18->kvs_config).custom_cmp_param;
    local_140 = 0;
    local_150 = (fdb_txn *)0x0;
    local_154 = FDB_RESULT_SUCCESS;
    local_161 = '\0';
    while( true ) {
      if (local_18->shandle == (snap_handle *)0x0) {
        fdb_check_file_reopen(local_18,&local_161);
        fdb_sync_db_header(in_stack_fffffffffffffdd8);
        local_160 = local_18->file;
        if ((local_18->kvs == (kvs_info *)0x0) || (local_18->kvs->type != '\x01')) {
          fVar2 = filemgr_get_seqnum((filemgr *)0x13a747);
          local_18->seqnum = fVar2;
        }
        else {
          fVar2 = fdb_kvs_get_seqnum(in_stack_fffffffffffffd28,0x13a726);
          local_18->seqnum = fVar2;
        }
      }
      else {
        local_160 = local_18->file;
      }
      if ((local_28 != (list_elem *)0xffffffffffffffff) &&
         ((list_elem *)local_18->seqnum < local_28)) {
        return FDB_RESULT_NO_DB_INSTANCE;
      }
      local_148 = (filemgr *)calloc(1,0x208);
      if (local_148 == (filemgr *)0x0) {
        return FDB_RESULT_ALLOC_FAIL;
      }
      atomic_init_uint8_t((atomic<unsigned_char> *)in_stack_fffffffffffffd30,
                          (uint8_t)((ulong)in_stack_fffffffffffffd28 >> 0x38));
      *(fdb_log_callback *)&local_148->in_place_compaction = (local_18->log_callback).callback;
      local_148->kv_header = (kvs_header *)(local_18->log_callback).callback_ex;
      local_148->free_kv_header = (_func_void_filemgr_ptr *)(local_18->log_callback).ctx_data;
      (local_148->plock).inactive.head = local_28;
      (local_148->last_commit).super___atomic_base<unsigned_long>._M_i =
           (__int_type)local_18->fhandle;
      local_fc = local_fc | 2;
      local_f2 = 0;
      bVar4 = 0;
      if (local_18->shandle != (snap_handle *)0x0) {
        in_stack_fffffffffffffd68 = (fdb_kvs_handle *)&local_148->version;
        atomic_get_uint64_t((atomic<unsigned_long> *)in_stack_fffffffffffffd30,
                            (memory_order)((ulong)in_stack_fffffffffffffd28 >> 0x20));
        atomic_store_uint64_t
                  ((atomic<unsigned_long> *)in_stack_fffffffffffffd30,
                   (uint64_t)in_stack_fffffffffffffd28,memory_order_relaxed);
        local_154 = wal_snapshot_clone((snap_handle *)in_stack_fffffffffffffd38,
                                       (snap_handle **)in_stack_fffffffffffffd30,
                                       (fdb_seqnum_t)in_stack_fffffffffffffd28);
        if (local_154 != FDB_RESULT_SUCCESS) {
          fdb_log_impl(&local_18->log_callback,2,(fdb_status)(ulong)(uint)local_154,
                       "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/forestdb.cc"
                       ,"fdb_snapshot_open",0x421,
                       "Warning: Snapshot clone at sequence number %ludoes not match its snapshot handle %luin file \'%s\'."
                       ,local_28,local_18->seqnum,local_18->file->filename);
          free(local_148);
          return local_154;
        }
        bVar4 = 1;
        (local_148->plock).inactive.head = (list_elem *)0xffffffffffffffff;
        local_154 = FDB_RESULT_SUCCESS;
      }
      root_handle = *(fdb_kvs_handle **)&local_18->kvs_config;
      handle_00 = (fdb_kvs_handle *)local_18->kvs;
      if ((local_148->plock).active.head == (list_elem *)0x0) {
        local_150 = local_18->fhandle->root->txn;
        if (local_150 == (fdb_txn *)0x0) {
          local_150 = &local_18->file->global_txn;
        }
        if (local_18->kvs != (kvs_info *)0x0) {
          local_140 = local_18->kvs->id;
        }
        if (local_28 == (list_elem *)0xffffffffffffffff) {
          memset(&stack0xfffffffffffffdb8,0,0xe0);
          (local_148->plock).active.head = (list_elem *)&stack0xfffffffffffffdb8;
        }
        else {
          local_154 = wal_dur_snapshot_open
                                ((fdb_seqnum_t)in_stack_fffffffffffffd58,
                                 (_fdb_key_cmp_info *)in_stack_fffffffffffffd50,
                                 in_stack_fffffffffffffd48,(fdb_txn *)in_stack_fffffffffffffd40,
                                 (snap_handle **)in_stack_fffffffffffffd38);
        }
        if (local_154 != FDB_RESULT_SUCCESS) {
          free(local_148);
          return local_154;
        }
      }
      if (local_18->kvs == (kvs_info *)0x0) {
        if ((bVar4 & 1) == 0) {
          local_154 = _fdb_open(in_stack_000019c8,in_stack_000019c0,in_stack_000019bc,
                                in_stack_000019b0);
          is_multi_kv = (undefined1)((ulong)handle_00 >> 0x38);
        }
        else {
          local_154 = _fdb_clone_snapshot(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
          is_multi_kv = (undefined1)((ulong)handle_00 >> 0x38);
        }
      }
      else if ((bVar4 & 1) == 0) {
        in_stack_fffffffffffffd50 = (filemgr *)local_18->kvs->root;
        in_stack_fffffffffffffd60 = (fdb_kvs_handle *)((avl_node *)&local_160->filename)->parent;
        in_stack_fffffffffffffd58 = local_160;
        _fdb_kvs_get_name(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
        in_stack_fffffffffffffd28 = local_148;
        local_154 = _fdb_kvs_open(root_handle,
                                  (fdb_config *)CONCAT17(bVar4,in_stack_fffffffffffffd90),
                                  in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,
                                  in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,handle_00);
        is_multi_kv = (undefined1)((ulong)handle_00 >> 0x38);
      }
      else {
        local_154 = _fdb_kvs_clone_snapshot(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
        is_multi_kv = (undefined1)((ulong)handle_00 >> 0x38);
      }
      if (local_154 == FDB_RESULT_SUCCESS) break;
      *local_20 = 0;
      if (((bVar4 & 1) != 0) || (local_28 != (list_elem *)0xffffffffffffffff)) {
        wal_snapshot_close((snap_handle *)in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
      }
      free(local_148);
      if (((local_154 != FDB_RESULT_NO_DB_INSTANCE) || (local_161 != '\x01')) ||
         (fVar1 = filemgr_get_file_status((filemgr *)0x13af17), fVar1 != '\x04')) goto LAB_0013af28;
    }
    if ((local_28 == (list_elem *)0xffffffffffffffff) && (local_18->shandle == (snap_handle *)0x0))
    {
      (local_148->plock).inactive.head = (list_elem *)local_18->seqnum;
      pfVar3 = filemgr_dirty_update_get_latest(in_stack_fffffffffffffd30);
      btreeblk_set_dirty_update((btreeblk_handle *)(local_148->header).revnum,pfVar3);
      if (pfVar3 != (filemgr_dirty_update_node *)0x0) {
        filemgr_dirty_update_get_root
                  ((filemgr *)local_148->wal,pfVar3,(bid_t *)&stack0xfffffffffffffd88,
                   (bid_t *)&stack0xfffffffffffffd80);
        _fdb_import_dirty_root
                  ((fdb_kvs_handle *)in_stack_fffffffffffffd30,(bid_t)in_stack_fffffffffffffd28,
                   0x13aceb);
        btreeblk_discard_blocks((btreeblk_handle *)in_stack_fffffffffffffd30);
      }
      local_154 = wal_dur_snapshot_open
                            ((fdb_seqnum_t)in_stack_fffffffffffffd58,
                             (_fdb_key_cmp_info *)in_stack_fffffffffffffd50,
                             in_stack_fffffffffffffd48,(fdb_txn *)in_stack_fffffffffffffd40,
                             (snap_handle **)in_stack_fffffffffffffd38);
      if (local_154 == FDB_RESULT_SUCCESS) {
        local_154 = wal_copyto_snapshot(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                                        (bool)is_multi_kv);
      }
    }
    else if (((bVar4 & 1) != 0) &&
            ((local_148->plock).inactive.head = (list_elem *)local_18->seqnum,
            local_28 == (list_elem *)0xffffffffffffffff)) {
      *(bid_t *)((local_148->last_writable_bmp_revnum).super___atomic_base<unsigned_long>._M_i + 8)
           = local_18->trie->root_bid;
      if ((char)(local_148->header).op_stat.num_gets.super___atomic_base<unsigned_long>._M_i ==
          '\x01') {
        if ((local_148->pos).super___atomic_base<unsigned_long>._M_i == 0) {
          *(bid_t *)(*(long *)&local_148->io_in_prog + 8) = ((local_18->field_6).seqtree)->root_bid;
        }
        else {
          *(bid_t *)(*(long *)&local_148->io_in_prog + 8) = ((local_18->field_6).seqtree)->root_bid;
        }
      }
      btreeblk_discard_blocks((btreeblk_handle *)in_stack_fffffffffffffd30);
      pfVar3 = btreeblk_get_dirty_update(local_18->bhandle);
      filemgr_dirty_update_inc_ref_count((filemgr_dirty_update_node *)0x13ae73);
      btreeblk_set_dirty_update((btreeblk_handle *)(local_148->header).revnum,pfVar3);
    }
    *local_20 = local_148;
LAB_0013af28:
    local_c = local_154;
  }
  return local_c;
}

Assistant:

LIBFDB_API
fdb_status fdb_snapshot_open(fdb_kvs_handle *handle_in,
                             fdb_kvs_handle **ptr_handle, fdb_seqnum_t seqnum)
{
#ifdef _MEMPOOL
    mempool_init();
#endif

    if (!handle_in || !ptr_handle) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    fdb_config config = handle_in->config;
    fdb_kvs_config kvs_config = handle_in->kvs_config;
    fdb_kvs_id_t kv_id = 0;
    fdb_kvs_handle *handle;
    fdb_txn *txn = NULL;
    fdb_status fs = FDB_RESULT_SUCCESS;
    filemgr *file;
    file_status_t fstatus = FILE_NORMAL;
    struct snap_handle dummy_shandle;
    struct _fdb_key_cmp_info cmp_info;
    LATENCY_STAT_START();

fdb_snapshot_open_start:
    if (!handle_in->shandle) {
        fdb_check_file_reopen(handle_in, &fstatus);
        fdb_sync_db_header(handle_in);
        file = handle_in->file;

        if (handle_in->kvs && handle_in->kvs->type == KVS_SUB) {
            handle_in->seqnum = fdb_kvs_get_seqnum(file,
                                                   handle_in->kvs->id);
        } else {
            handle_in->seqnum = filemgr_get_seqnum(file);
        }
    } else {
        file = handle_in->file;
    }

    // if the max sequence number seen by this handle is lower than the
    // requested snapshot marker, it means the snapshot is not yet visible
    // even via the current fdb_kvs_handle
    if (seqnum != FDB_SNAPSHOT_INMEM && seqnum > handle_in->seqnum) {
        return FDB_RESULT_NO_DB_INSTANCE;
    }

    handle = (fdb_kvs_handle *) calloc(1, sizeof(fdb_kvs_handle));
    if (!handle) { // LCOV_EXCL_START
        return FDB_RESULT_ALLOC_FAIL;
    } // LCOV_EXCL_STOP

    atomic_init_uint8_t(&handle->handle_busy, 0);
    handle->log_callback = handle_in->log_callback;
    handle->max_seqnum = seqnum;
    handle->fhandle = handle_in->fhandle;

    config.flags |= FDB_OPEN_FLAG_RDONLY;
    // do not perform compaction for snapshot
    config.compaction_mode = FDB_COMPACTION_MANUAL;

    // If cloning an existing snapshot handle, then rewind indexes
    // to its last DB header and point its avl tree to existing snapshot's tree
    bool clone_snapshot = false;
    if (handle_in->shandle) {
        atomic_store_uint64_t(&handle->last_hdr_bid,  // do fast rewind
                              atomic_get_uint64_t(&handle_in->last_hdr_bid));
        fs = wal_snapshot_clone(handle_in->shandle, &handle->shandle, seqnum);
        if (fs == FDB_RESULT_SUCCESS) {
            clone_snapshot = true;
            handle->max_seqnum = FDB_SNAPSHOT_INMEM; // temp value to skip WAL
        } else {
            fdb_log(&handle_in->log_callback, FDB_LOG_ERROR, fs,
                    "Warning: Snapshot clone at sequence number %" _F64
                    "does not match its snapshot handle %" _F64
                    "in file '%s'.", seqnum, handle_in->seqnum,
                    handle_in->file->filename);
            free(handle);
            return fs;
        }
    }

    cmp_info.kvs_config = handle_in->kvs_config;
    cmp_info.kvs = handle_in->kvs;

    if (!handle->shandle) {
        txn = handle_in->fhandle->root->txn;
        if (!txn) {
            txn = &handle_in->file->global_txn;
        }
        if (handle_in->kvs) {
            kv_id = handle_in->kvs->id;
        }
        if (seqnum == FDB_SNAPSHOT_INMEM) {
            memset(&dummy_shandle, 0, sizeof(struct snap_handle));
            // tmp value to denote snapshot & not rollback to _fdb_open
            handle->shandle = &dummy_shandle; // dummy
        } else {
            fs = wal_dur_snapshot_open(seqnum, &cmp_info, file, txn,
                                       &handle->shandle);
        }
        if (fs != FDB_RESULT_SUCCESS) {
            free(handle);
            return fs;
        }
    }

    if (handle_in->kvs) {
        // sub-handle in multi KV instance mode
        if (clone_snapshot) {
            fs = _fdb_kvs_clone_snapshot(handle_in, handle);
        } else {
            fs = _fdb_kvs_open(handle_in->kvs->root,
                              &config, &kvs_config, file,
                              file->filename,
                              _fdb_kvs_get_name(handle_in, file),
                              handle);
        }
    } else {
        if (clone_snapshot) {
            fs = _fdb_clone_snapshot(handle_in, handle);
        } else {
            fs = _fdb_open(handle, file->filename, FDB_AFILENAME, &config);
        }
    }

    if (fs == FDB_RESULT_SUCCESS) {
        if (seqnum == FDB_SNAPSHOT_INMEM &&
            !handle_in->shandle) {
            handle->max_seqnum = handle_in->seqnum;

            // synchronize dirty root nodes if exist
            bid_t dirty_idtree_root = BLK_NOT_FOUND;
            bid_t dirty_seqtree_root = BLK_NOT_FOUND;
            struct filemgr_dirty_update_node *dirty_update;

            dirty_update = filemgr_dirty_update_get_latest(handle->file);
            btreeblk_set_dirty_update(handle->bhandle, dirty_update);

            if (dirty_update) {
                filemgr_dirty_update_get_root(handle->file, dirty_update,
                                       &dirty_idtree_root, &dirty_seqtree_root);
                _fdb_import_dirty_root(handle, dirty_idtree_root,
                                       dirty_seqtree_root);
                btreeblk_discard_blocks(handle->bhandle);
            }
            // Having synced the dirty root, make an in-memory WAL snapshot
            // TODO: Re-enable WAL sharing once ready...
#ifdef _MVCC_WAL_ENABLE
            fs = wal_snapshot_open(handle->file, txn, kv_id, seqnum,
                                   &cmp_info, &handle->shandle);
#else
            fs = wal_dur_snapshot_open(handle->seqnum, &cmp_info, file, txn,
                                       &handle->shandle);
            if (fs == FDB_RESULT_SUCCESS) {
                fs = wal_copyto_snapshot(file, handle->shandle,
                                        (bool)handle_in->kvs);
            }
            (void)kv_id;
#endif // _MVCC_WAL_ENABLE
        } else if (clone_snapshot) {
            // Snapshot is created on the other snapshot handle

            handle->max_seqnum = handle_in->seqnum;

            if (seqnum == FDB_SNAPSHOT_INMEM) {
                // in-memory snapshot
                // Clone dirty root nodes from the source snapshot by incrementing
                // their ref counters
                handle->trie->root_bid = handle_in->trie->root_bid;
                if (handle->config.seqtree_opt == FDB_SEQTREE_USE) {
                    if (handle->kvs) {
                        handle->seqtrie->root_bid = handle_in->seqtrie->root_bid;
                    } else {
                        handle->seqtree->root_bid = handle_in->seqtree->root_bid;
                    }
                }
                btreeblk_discard_blocks(handle->bhandle);

                // increase ref count for dirty update
                struct filemgr_dirty_update_node *dirty_update;
                dirty_update = btreeblk_get_dirty_update(handle_in->bhandle);
                filemgr_dirty_update_inc_ref_count(dirty_update);
                btreeblk_set_dirty_update(handle->bhandle, dirty_update);
            }
        }
        *ptr_handle = handle;
    } else {
        *ptr_handle = NULL;
        if (clone_snapshot || seqnum != FDB_SNAPSHOT_INMEM) {
            wal_snapshot_close(handle->shandle, handle->file);
        }
        free(handle);
        // If compactor thread had finished compaction just before this routine
        // calls _fdb_open, then it is possible that the snapshot's DB header
        // is only present in the new_file. So we must retry the snapshot
        // open attempt IFF _fdb_open indicates FDB_RESULT_NO_DB_INSTANCE..
        if (fs == FDB_RESULT_NO_DB_INSTANCE && fstatus == FILE_COMPACT_OLD) {
            if (filemgr_get_file_status(file) == FILE_REMOVED_PENDING) {
                goto fdb_snapshot_open_start;
            }
        }
    }

    if (handle_in->shandle) {
        LATENCY_STAT_END(file, FDB_LATENCY_SNAP_CLONE);
    } else if (seqnum == FDB_SNAPSHOT_INMEM) {
        LATENCY_STAT_END(file, FDB_LATENCY_SNAP_INMEM);
    } else {
        LATENCY_STAT_END(file, FDB_LATENCY_SNAP_DUR);
    }
    return fs;
}